

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O2

void __thiscall tetgenmesh::memorypool::traversalinit(memorypool *this)

{
  void **ppvVar1;
  
  ppvVar1 = this->firstblock;
  this->pathblock = ppvVar1;
  this->pathitem =
       (void *)((long)ppvVar1 +
               (((long)this->alignbytes + 8U) - (ulong)(ppvVar1 + 1) % (ulong)(long)this->alignbytes
               ));
  this->pathitemsleft = this->itemsperblock;
  return;
}

Assistant:

void tetgenmesh::memorypool::traversalinit()
{
  uintptr_t alignptr;

  // Begin the traversal in the first block.
  pathblock = firstblock;
  // Find the first item in the block.  Increment by the size of (void *).
  alignptr = (uintptr_t) (pathblock + 1);
  // Align with item on an `alignbytes'-byte boundary.
  pathitem = (void *)
    (alignptr + (uintptr_t) alignbytes -
     (alignptr % (uintptr_t) alignbytes));
  // Set the number of items left in the current block.
  pathitemsleft = itemsperblock;
}